

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.h
# Opt level: O0

void __thiscall
google::protobuf::compiler::rust::AccessorGenerator::GenerateMsgImpl
          (AccessorGenerator *this,Context *ctx,FieldDescriptor *field,AccessorCase accessor_case)

{
  initializer_list<google::protobuf::io::Printer::Sub> v;
  Printer *this_00;
  undefined4 in_register_0000000c;
  FieldDescriptor *field_00;
  Sub *local_1b0;
  string_view local_190;
  basic_string_view<char,_std::char_traits<char>_> local_178;
  undefined1 local_161;
  string local_160;
  allocator<char> local_129;
  string local_128;
  Sub *local_108;
  Sub local_100;
  iterator local_48;
  size_type local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_38;
  undefined4 local_24;
  undefined8 uStack_20;
  AccessorCase accessor_case_local;
  FieldDescriptor *field_local;
  Context *ctx_local;
  AccessorGenerator *this_local;
  
  field_00 = (FieldDescriptor *)CONCAT44(in_register_0000000c,accessor_case);
  local_161 = 1;
  local_108 = &local_100;
  local_24 = accessor_case;
  uStack_20 = field;
  field_local = (FieldDescriptor *)ctx;
  ctx_local = (Context *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"comment",&local_129);
  FieldInfoComment_abi_cxx11_(&local_160,(rust *)field_local,(Context *)uStack_20,field_00);
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_100,&local_128,&local_160);
  local_161 = 0;
  local_48 = &local_100;
  local_40 = 1;
  v._M_len = 1;
  v._M_array = local_48;
  absl::lts_20240722::Span<google::protobuf::io::Printer::Sub_const>::
  Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
            ((Span<google::protobuf::io::Printer::Sub_const> *)local_38._M_local_buf,v);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_178,"\n      // $comment$\n    ");
  io::Printer::SourceLocation::current();
  Context::Emit(ctx,local_38._M_allocated_capacity,local_38._8_8_,local_178._M_len,local_178._M_str)
  ;
  local_1b0 = (Sub *)&local_48;
  do {
    local_1b0 = local_1b0 + -1;
    io::Printer::Sub::~Sub(local_1b0);
  } while (local_1b0 != &local_100);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator(&local_129);
  (*this->_vptr_AccessorGenerator[2])(this,field_local,uStack_20,(ulong)(uint)local_24);
  this_00 = Context::printer((Context *)field_local);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_190,"\n");
  io::Printer::PrintRaw(this_00,local_190);
  return;
}

Assistant:

void GenerateMsgImpl(Context& ctx, const FieldDescriptor& field,
                       AccessorCase accessor_case) const {
    ctx.Emit({{"comment", FieldInfoComment(ctx, field)}}, R"rs(
      // $comment$
    )rs");
    InMsgImpl(ctx, field, accessor_case);
    ctx.printer().PrintRaw("\n");
  }